

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string_view cinatra::get_chuncked_buffers<false,false>(size_t length,array<char,_24UL> *buffer)

{
  pointer pvVar1;
  char *pcVar2;
  size_type __len;
  char *__first;
  array<char,_24UL> *in_RSI;
  to_chars_result tVar3;
  char *ptr;
  int __base;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  string_view local_10;
  
  pvVar1 = std::array<char,_24UL>::data((array<char,_24UL> *)0x68fb38);
  __base = (int)((ulong)(pvVar1 + 2) >> 0x20);
  pvVar1 = std::array<char,_24UL>::data((array<char,_24UL> *)0x68fb4a);
  std::array<char,_24UL>::size(in_RSI);
  tVar3 = std::to_chars(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(unsigned_long)pvVar1,
                        __base);
  pcVar2 = tVar3.ptr;
  *pcVar2 = '\r';
  __first = pcVar2 + 2;
  pcVar2[1] = '\n';
  pvVar1 = std::array<char,_24UL>::data((array<char,_24UL> *)0x68fbb2);
  std::array<char,_24UL>::data((array<char,_24UL> *)0x68fbc1);
  __len = std::distance<char*>(__first,pvVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10,pvVar1,__len);
  return local_10;
}

Assistant:

inline std::string_view get_chuncked_buffers(size_t length,
                                             std::array<char, 24> &buffer) {
  if constexpr (is_last_time) {
    return std::string_view{"\r\n0\r\n\r\n"};
  }
  else {
    auto [ptr, ec] = std::to_chars(
        buffer.data() + 2, buffer.data() + buffer.size() - 2, length, 16);
    *ptr++ = '\r';
    *ptr++ = '\n';
    if constexpr (is_first_time) {
      buffer[0] = '\r';
      buffer[1] = '\n';
      return std::string_view(buffer.data() + 2,
                              std::distance(buffer.data() + 2, ptr));
    }
    else {
      return std::string_view(buffer.data(), std::distance(buffer.data(), ptr));
    }
  }
}